

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void checkList(IntegrityCk *pCheck,int isFreeList,int iPage,int N,char *zContext)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  u32 uVar4;
  uint *puVar5;
  bool bVar6;
  DbPage *pPg;
  int iVar7;
  u32 uVar8;
  uint uVar9;
  int iVar10;
  uint uVar11;
  uint uVar12;
  ulong uVar13;
  uint uVar14;
  uint uVar15;
  DbPage *pOvflPage;
  DbPage *local_38;
  
  uVar14 = iPage;
  uVar11 = N;
  while( true ) {
    if ((int)uVar11 < 1) {
      return;
    }
    if (pCheck->mxErr == 0) break;
    uVar12 = uVar11 - 1;
    if ((int)uVar14 < 1) {
      bVar6 = false;
      checkAppendMsg(pCheck,zContext,"%d of %d pages missing from overflow list starting at %d",
                     (ulong)uVar11,(ulong)(uint)N,(ulong)(uint)iPage);
      uVar11 = uVar12;
    }
    else {
      iVar7 = checkRef(pCheck,uVar14,zContext);
      if (iVar7 == 0) {
        iVar7 = sqlite3PagerAcquire(pCheck->pPager,uVar14,&local_38,0);
        pPg = local_38;
        if (iVar7 == 0) {
          puVar5 = (uint *)local_38->pData;
          if (isFreeList == 0) {
            if ((uVar11 != 1) && (pCheck->pBt->autoVacuum != '\0')) {
              uVar11 = *puVar5;
              checkPtrmap(pCheck,uVar11 >> 0x18 | (uVar11 & 0xff0000) >> 8 | (uVar11 & 0xff00) << 8
                                 | uVar11 << 0x18,'\x04',uVar14,zContext);
            }
          }
          else {
            uVar9 = puVar5[1];
            bVar1 = *(byte *)((long)puVar5 + 5);
            bVar2 = *(byte *)((long)puVar5 + 6);
            bVar3 = *(byte *)((long)puVar5 + 7);
            if (pCheck->pBt->autoVacuum != '\0') {
              checkPtrmap(pCheck,uVar14,'\x02',0,zContext);
            }
            iVar7 = (uint)(byte)uVar9 * 0x1000000;
            iVar10 = (uint)bVar1 * 0x10000;
            uVar15 = (uint)bVar2 * 0x100;
            uVar9 = iVar10 + iVar7 | uVar15 | (uint)bVar3;
            uVar4 = pCheck->pBt->usableSize;
            uVar8 = uVar4 + 3;
            if (-1 < (int)uVar4) {
              uVar8 = uVar4;
            }
            if (((int)uVar8 >> 2) + -2 < (int)uVar9) {
              checkAppendMsg(pCheck,zContext,"freelist leaf count too big on page %d",(ulong)uVar14)
              ;
              uVar12 = uVar11 - 2;
            }
            else {
              if (0 < (int)uVar9) {
                uVar13 = 0;
                do {
                  uVar14 = puVar5[uVar13 + 2];
                  uVar14 = uVar14 >> 0x18 | (uVar14 & 0xff0000) >> 8 | (uVar14 & 0xff00) << 8 |
                           uVar14 << 0x18;
                  if (pCheck->pBt->autoVacuum != '\0') {
                    checkPtrmap(pCheck,uVar14,'\x02',0,zContext);
                  }
                  checkRef(pCheck,uVar14,zContext);
                  uVar13 = uVar13 + 1;
                } while (uVar15 + bVar3 + iVar7 + iVar10 != uVar13);
              }
              uVar12 = uVar12 - uVar9;
            }
          }
          uVar14 = *puVar5;
          uVar14 = uVar14 >> 0x18 | (uVar14 & 0xff0000) >> 8 | (uVar14 & 0xff00) << 8 |
                   uVar14 << 0x18;
          sqlite3PagerUnref(pPg);
          bVar6 = true;
          uVar11 = uVar12;
        }
        else {
          bVar6 = false;
          checkAppendMsg(pCheck,zContext,"failed to get page %d");
          uVar11 = uVar12;
        }
      }
      else {
        bVar6 = false;
        uVar11 = uVar12;
      }
    }
    if (!bVar6) {
      return;
    }
  }
  return;
}

Assistant:

static void checkList(
  IntegrityCk *pCheck,  /* Integrity checking context */
  int isFreeList,       /* True for a freelist.  False for overflow page list */
  int iPage,            /* Page number for first page in the list */
  int N,                /* Expected number of pages in the list */
  char *zContext        /* Context for error messages */
){
  int i;
  int expected = N;
  int iFirst = iPage;
  while( N-- > 0 && pCheck->mxErr ){
    DbPage *pOvflPage;
    unsigned char *pOvflData;
    if( iPage<1 ){
      checkAppendMsg(pCheck, zContext,
         "%d of %d pages missing from overflow list starting at %d",
          N+1, expected, iFirst);
      break;
    }
    if( checkRef(pCheck, iPage, zContext) ) break;
    if( sqlite3PagerGet(pCheck->pPager, (Pgno)iPage, &pOvflPage) ){
      checkAppendMsg(pCheck, zContext, "failed to get page %d", iPage);
      break;
    }
    pOvflData = (unsigned char *)sqlite3PagerGetData(pOvflPage);
    if( isFreeList ){
      int n = get4byte(&pOvflData[4]);
#ifndef SQLITE_OMIT_AUTOVACUUM
      if( pCheck->pBt->autoVacuum ){
        checkPtrmap(pCheck, iPage, PTRMAP_FREEPAGE, 0, zContext);
      }
#endif
      if( n>(int)pCheck->pBt->usableSize/4-2 ){
        checkAppendMsg(pCheck, zContext,
           "freelist leaf count too big on page %d", iPage);
        N--;
      }else{
        for(i=0; i<n; i++){
          Pgno iFreePage = get4byte(&pOvflData[8+i*4]);
#ifndef SQLITE_OMIT_AUTOVACUUM
          if( pCheck->pBt->autoVacuum ){
            checkPtrmap(pCheck, iFreePage, PTRMAP_FREEPAGE, 0, zContext);
          }
#endif
          checkRef(pCheck, iFreePage, zContext);
        }
        N -= n;
      }
    }
#ifndef SQLITE_OMIT_AUTOVACUUM
    else{
      /* If this database supports auto-vacuum and iPage is not the last
      ** page in this overflow list, check that the pointer-map entry for
      ** the following page matches iPage.
      */
      if( pCheck->pBt->autoVacuum && N>0 ){
        i = get4byte(pOvflData);
        checkPtrmap(pCheck, i, PTRMAP_OVERFLOW2, iPage, zContext);
      }
    }
#endif
    iPage = get4byte(pOvflData);
    sqlite3PagerUnref(pOvflPage);
  }
}